

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_iterator.h
# Opt level: O2

void __thiscall
spvtools::opt::TreeDFIterator<spvtools::opt::Loop>::TreeDFIterator
          (TreeDFIterator<spvtools::opt::Loop> *this,NodePtr top_node)

{
  pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>
  local_20;
  
  this->current_ = top_node;
  std::
  stack<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>>
  ::
  stack<std::deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>,void>
            (&this->parent_iterators_);
  local_20.first = this->current_;
  if ((local_20.first != (NodePtr)0x0) &&
     (local_20.second._M_current =
           ((local_20.first)->nested_loops_).
           super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl
           .super__Vector_impl_data._M_start,
     local_20.second._M_current !=
     ((local_20.first)->nested_loops_).
     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    std::
    deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>
    ::
    emplace_back<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>
              ((deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>
                *)&this->parent_iterators_,&local_20);
  }
  return;
}

Assistant:

explicit inline TreeDFIterator(NodePtr top_node) : current_(top_node) {
    if (current_ && current_->begin() != current_->end())
      parent_iterators_.emplace(make_pair(current_, current_->begin()));
  }